

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O0

void squall::detail::
     construct_object<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>>
               (HSQUIRRELVM vm,
               function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *v)

{
  undefined8 *puVar1;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this;
  _func_SQInteger_SQUserPointer_SQInteger *idx;
  SQRELEASEHOOK in_stack_ffffffffffffffc0;
  SQRELEASEHOOK hook;
  SQUserPointer p;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *v_local;
  HSQUIRRELVM vm_local;
  
  puVar1 = (undefined8 *)sq_newuserdata(vm,(SQUnsignedInteger)v);
  this = (function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)operator_new(0x20);
  std::
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this,v);
  *puVar1 = this;
  idx = construct_object(SQVM*,std::function_const&)::{lambda(void*,long_long)#1}::
        operator_cast_to_function_pointer((_lambda_void__long_long__1_ *)&stack0xffffffffffffffc7);
  sq_setreleasehook((HSQUIRRELVM)hook,(SQInteger)idx,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void construct_object(HSQUIRRELVM vm, const T& v) {
    SQUserPointer p = sq_newuserdata(vm, sizeof(T*));
    *((T**)p) = new T(v);
    SQRELEASEHOOK hook = [](SQUserPointer p, SQInteger)->SQInteger {
        delete *((T**)p);
        return 0;
    };
    sq_setreleasehook(vm, -1, hook);
}